

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Histogram.cpp
# Opt level: O2

shared_ptr<Image> __thiscall Histogram::toImage(Histogram *this,uint height_per_channel)

{
  char cVar1;
  Pixel PVar2;
  uchar uVar3;
  int iVar4;
  Pixel *pPVar5;
  uint in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  int y;
  int iVar7;
  ulong uVar8;
  int y_1;
  uint uVar9;
  ulong uVar10;
  undefined4 in_register_00000034;
  Histogram *this_00;
  long lVar11;
  int i;
  int x;
  shared_ptr<Image> sVar12;
  Pixel local_68;
  int local_64;
  uint local_60;
  int local_5c;
  long local_58;
  Histogram *local_50;
  ulong local_48;
  long local_40;
  int local_38;
  uint local_34;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  this_00 = (Histogram *)CONCAT44(in_register_00000034,height_per_channel);
  uVar8 = (ulong)in_EDX;
  local_34 = this_00->range;
  local_38 = this_00->channels * in_EDX;
  sVar12 = std::make_shared<Image,unsigned_int,unsigned_int>((uint *)this,&local_34);
  _Var6 = sVar12.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_64 = in_EDX - 1;
  lVar11 = 0;
  local_50 = this_00;
  local_48 = uVar8;
  while (lVar11 < this_00->channels) {
    local_60 = max(this_00,(int)lVar11);
    local_58 = lVar11 + 1;
    local_5c = (int)local_58 * (int)uVar8;
    uVar10 = 0;
    _Var6._M_pi = extraout_RDX;
    local_40 = lVar11;
    while( true ) {
      x = (int)uVar10;
      if (this_00->range <= x) break;
      cVar1 = (char)(uVar10 >> 1);
      local_68.colors[1] = 0x80 - cVar1;
      uVar3 = cVar1 + 0x80;
      local_68.colors[0] = local_68.colors[1];
      local_68.colors[2] = local_68.colors[1];
      local_68.colors[3] = 0xff;
      if (lVar11 == 3) {
        local_68.colors[3] = uVar3;
        local_68.colors[0] = 0xff;
        local_68.colors[1] = 0xff;
        local_68.colors[2] = 0xff;
      }
      local_68.colors[lVar11] = uVar3;
      iVar4 = operator()(this_00,(uchar)uVar10,(int)lVar11);
      PVar2.colors = local_68.colors;
      uVar8 = (ulong)(uint)(iVar4 * (int)uVar8);
      uVar10 = uVar8 / local_60;
      _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar8 % (ulong)local_60);
      iVar4 = local_64;
      for (iVar7 = 0; lVar11 = local_40, uVar8 = local_48, this_00 = local_50, iVar7 < (int)uVar10;
          iVar7 = iVar7 + 1) {
        pPVar5 = Image::operator()(*(Image **)this,x,iVar4);
        *&pPVar5->colors = PVar2.colors;
        iVar4 = iVar4 + -1;
        _Var6._M_pi = extraout_RDX_00;
      }
      while (uVar9 = (uint)uVar10, uVar9 < (uint)uVar8) {
        pPVar5 = Image::operator()(*(Image **)this,x,~uVar9 + local_5c);
        *(undefined4 *)pPVar5->colors = 0xff000000;
        _Var6._M_pi = extraout_RDX_01;
        uVar10 = (ulong)(uVar9 + 1);
      }
      uVar10 = (ulong)(x + 1);
    }
    local_64 = local_64 + (int)uVar8;
    lVar11 = local_58;
  }
  sVar12.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi;
  sVar12.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Image>)sVar12.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Image> Histogram::toImage(unsigned int height_per_channel) const {
  auto img = std::make_shared<Image>((unsigned int) range, channels * height_per_channel);

  // Create a black background color for the histogram
  Pixel black = {{0, 0, 0, 255}};

  // Loop over all channels
  for (int c = 0; c < channels; c++) {
    // Find the channel maximum value to scale down the bars
    int scale = max(c);
    // Loop over all intensities
    for (int i = 0; i < range; i++) {

      // Create a color for this bar based on intensity position
      auto color = (unsigned char) (128 + i / 2);
      auto inverse = (unsigned char) (128 - i / 2);

      Pixel pixel = {{inverse, inverse, inverse, 255}};

      // If this is the alpha channel, the color should be white and slowly fade out
      if (c == 3) {
        pixel = {{255, 255, 255, color}};
      }

      // Set the actual channel to the color based on intensity
      pixel.colors[c] = color;

      // Figure out the height of the histogram bar, but use dB
      auto bar_height = (int) ((height_per_channel * count((unsigned char) i, c)) / scale);

      // Draw the bar vertically
      for (int y = 0; y < bar_height; y++) {
        int ty = ((c + 1) * height_per_channel - 1) - y;
        img->pixel(i, ty) = pixel;
      }

      // Color the rest of the pixels black
      for (int y = bar_height; y < height_per_channel; y++) {
        int ty = ((c + 1) * height_per_channel - 1) - y;
        img->pixel(i, ty) = black;
      }
    }
  }

  return img;
}